

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall AsymmetricAlgorithm::isWrappingMech(AsymmetricAlgorithm *this,Type padding)

{
  Type padding_local;
  AsymmetricAlgorithm *this_local;
  bool local_1;
  
  if ((padding == RSA) || (padding == RSA_PKCS || padding == RSA_PKCS_OAEP)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AsymmetricAlgorithm::isWrappingMech(AsymMech::Type padding)
{
	switch (padding)
	{
		case AsymMech::RSA:
		case AsymMech::RSA_PKCS:
		case AsymMech::RSA_PKCS_OAEP:
			return true;

		default:
			return false;
	}
}